

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int nn_device_entry(nn_device_recipe *device,int s1,int s2,int flags)

{
  int iVar1;
  int *piVar2;
  size_t local_48;
  size_t opsz;
  nn_fd s2snd;
  nn_fd s2rcv;
  nn_fd s1snd;
  nn_fd s1rcv;
  int op2;
  int op1;
  int rc;
  int flags_local;
  int s2_local;
  int s1_local;
  nn_device_recipe *device_local;
  
  op1 = flags;
  rc = s2;
  flags_local = s1;
  _s2_local = device;
  if ((((device->required_checks & 1U) != 0) && (s1 < 0)) && (s2 < 0)) {
    piVar2 = __errno_location();
    *piVar2 = 9;
    return -1;
  }
  if ((device->required_checks & 2U) != 0) {
    if (s2 < 0) {
      iVar1 = nn_device_loopback(device,s1);
      return iVar1;
    }
    if (s1 < 0) {
      iVar1 = nn_device_loopback(device,s2);
      return iVar1;
    }
  }
  if ((device->required_checks & 0x10U) != 0) {
    local_48 = 4;
    op2 = nn_getsockopt(s1,0,0xc,&s1rcv,&local_48);
    if (op2 != 0) {
      return -1;
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op1)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x57);
      fflush(_stderr);
      nn_err_abort();
    }
    local_48 = 4;
    op2 = nn_getsockopt(rc,0,0xc,&s1snd,&local_48);
    if (op2 != 0) {
      return -1;
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op2)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x5c);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((s1rcv != 2) || (s1snd != 2)) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    op2 = 0;
  }
  if ((_s2_local->required_checks & 0x20U) != 0) {
    local_48 = 4;
    op2 = nn_getsockopt(flags_local,0,0xd,&s1rcv,&local_48);
    if (op2 != 0) {
      return -1;
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op1)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x69);
      fflush(_stderr);
      nn_err_abort();
    }
    local_48 = 4;
    op2 = nn_getsockopt(rc,0,0xd,&s1snd,&local_48);
    if (op2 != 0) {
      return -1;
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op2)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x6e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (s1rcv / 0x10 != s1snd / 0x10) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    op2 = 0;
  }
  local_48 = 4;
  op2 = nn_getsockopt(flags_local,0,0xb,&s2rcv,&local_48);
  if (op2 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    s2rcv = -1;
  }
  else {
    if (op2 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x7d);
      fflush(_stderr);
      nn_err_abort();
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (s1rcv)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x7e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (s2rcv < 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","s1rcv >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x7f);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  local_48 = 4;
  op2 = nn_getsockopt(flags_local,0,10,&s2snd,&local_48);
  if (op2 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    s2snd = -1;
  }
  else {
    if (op2 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x88);
      fflush(_stderr);
      nn_err_abort();
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (s1snd)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x89);
      fflush(_stderr);
      nn_err_abort();
    }
    if (s2snd < 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","s1snd >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x8a);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  local_48 = 4;
  op2 = nn_getsockopt(rc,0,0xb,(void *)((long)&opsz + 4),&local_48);
  if (op2 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    opsz._4_4_ = -1;
  }
  else {
    if (op2 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x93);
      fflush(_stderr);
      nn_err_abort();
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (s2rcv)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x94);
      fflush(_stderr);
      nn_err_abort();
    }
    if (opsz._4_4_ < 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","s2rcv >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x95);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  local_48 = 4;
  op2 = nn_getsockopt(rc,0,10,&opsz,&local_48);
  if (op2 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    opsz._0_4_ = -1;
  }
  else {
    if (op2 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x9e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (local_48 != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (s2snd)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0x9f);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((int)opsz < 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","s2snd >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0xa0);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  if ((_s2_local->required_checks & 0x40U) != 0) {
    if ((s2rcv != -1) && ((int)opsz == -1)) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    if ((s2snd != -1) && (opsz._4_4_ == -1)) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    if ((opsz._4_4_ != -1) && (s2snd == -1)) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    if (((int)opsz != -1) && (s2rcv == -1)) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
  }
  if (((((_s2_local->required_checks & 4U) == 0) || (s2rcv == -1)) || (s2snd == -1)) ||
     ((opsz._4_4_ == -1 || ((int)opsz == -1)))) {
    if ((_s2_local->required_checks & 8U) == 0) {
LAB_00120ff0:
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,200);
      fflush(_stderr);
      nn_err_abort();
    }
    if (((s2rcv == -1) || (s2snd != -1)) || ((opsz._4_4_ != -1 || ((int)opsz == -1)))) {
      if ((((s2rcv != -1) || (s2snd == -1)) || (opsz._4_4_ == -1)) || ((int)opsz != -1))
      goto LAB_00120ff0;
      device_local._4_4_ = nn_device_oneway(_s2_local,rc,opsz._4_4_,flags_local,s2snd);
    }
    else {
      device_local._4_4_ = nn_device_oneway(_s2_local,flags_local,s2rcv,rc,(int)opsz);
    }
  }
  else {
    device_local._4_4_ = nn_device_twoway(_s2_local,flags_local,s2rcv,s2snd,rc,opsz._4_4_,(int)opsz)
    ;
  }
  return device_local._4_4_;
}

Assistant:

int nn_device_entry (struct nn_device_recipe *device, int s1, int s2,
    NN_UNUSED int flags) 
{
    int rc;
    int op1;
    int op2;
    nn_fd s1rcv;
    nn_fd s1snd;
    nn_fd s2rcv;
    nn_fd s2snd;
    size_t opsz;

    /*  At least one socket must be specified. */
    if (device->required_checks & NN_CHECK_AT_LEAST_ONE_SOCKET) {
        if (s1 < 0 && s2 < 0) {
            errno = EBADF;
            return -1;
        }
    }

    /*  Handle the case when there's only one socket in the device. */
    if (device->required_checks & NN_CHECK_ALLOW_LOOPBACK) {
        if (s2 < 0)
            return nn_device_loopback (device, s1);
        if (s1 < 0)
            return nn_device_loopback (device, s2);
    }

    /*  Check whether both sockets are "raw" sockets. */
    if (device->required_checks & NN_CHECK_REQUIRE_RAW_SOCKETS) {
        opsz = sizeof (op1);
        rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_DOMAIN, &op1, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op1));
        opsz = sizeof (op2);
        rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_DOMAIN, &op2, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op2));
        if (op1 != AF_SP_RAW || op2 != AF_SP_RAW) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Check whether both sockets are from the same protocol. */
    if (device->required_checks & NN_CHECK_SAME_PROTOCOL_FAMILY) {
        opsz = sizeof (op1);
        rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_PROTOCOL, &op1, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op1));
        opsz = sizeof (op2);
        rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_PROTOCOL, &op2, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op2));
        if (op1 / 16 != op2 / 16) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Get the file descriptors for polling. */
    opsz = sizeof (s1rcv);
    rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_RCVFD, &s1rcv, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s1rcv = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s1rcv));
        nn_assert (s1rcv >= 0);
    }
    opsz = sizeof (s1snd);
    rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_SNDFD, &s1snd, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s1snd = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s1snd));
        nn_assert (s1snd >= 0);
    }
    opsz = sizeof (s2rcv);
    rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_RCVFD, &s2rcv, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s2rcv = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s2rcv));
        nn_assert (s2rcv >= 0);
    }
    opsz = sizeof (s2snd);
    rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_SNDFD, &s2snd, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s2snd = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s2snd));
        nn_assert (s2snd >= 0);
    }
    if (device->required_checks & NN_CHECK_SOCKET_DIRECTIONALITY) {
        /*  Check the directionality of the sockets. */
        if (s1rcv != -1 && s2snd == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s1snd != -1 && s2rcv == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s2rcv != -1 && s1snd == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s2snd != -1 && s1rcv == -1) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Two-directional device. */
    if (device->required_checks & NN_CHECK_ALLOW_BIDIRECTIONAL) {
        if (s1rcv != -1 && s1snd != -1 && s2rcv != -1 && s2snd != -1)
            return nn_device_twoway (device, s1, s1rcv, s1snd,
                s2, s2rcv, s2snd);
    }

    if (device->required_checks & NN_CHECK_ALLOW_UNIDIRECTIONAL) {
        /*  Single-directional device passing messages from s1 to s2. */
        if (s1rcv != -1 && s1snd == -1 && s2rcv == -1 && s2snd != -1)
            return nn_device_oneway (device,s1, s1rcv, s2, s2snd);

        /*  Single-directional device passing messages from s2 to s1. */
        if (s1rcv == -1 && s1snd != -1 && s2rcv != -1 && s2snd == -1)
            return nn_device_oneway (device,s2, s2rcv, s1, s1snd);
    }

    /*  This should never happen. */
    nn_assert (0);
}